

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.h
# Opt level: O3

ostream * __thiscall
testinator::
stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
::output(stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
         *this,ostream *s)

{
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)s,"(",1);
  ::std::ostream::operator<<
            ((ostream *)s,
             (this->m_t->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl
            );
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)s,")",1);
  return s;
}

Assistant:

std::ostream& output(std::ostream& s) const
  {
    s << m_f.opener(m_t);
    detail::for_each_in_tuple(m_t,
                              [&s, this] (auto&& e, size_t i)
                              { if (i > 0) s << m_f.separator(m_t);
                                s << prettyprint(std::forward<decltype(e)>(e)); });
    return s << m_f.closer(m_t);
  }